

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpApiRequest.cpp
# Opt level: O1

int __thiscall
xmrig::HttpApiRequest::accept(HttpApiRequest *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  size_t sVar4;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  StringRefType local_48;
  StringRefType local_38;
  GenericStringStream<rapidjson::UTF8<char>_> local_28;
  
  (this->super_ApiRequest).m_state = STATE_ACCEPTED;
  if ((this->m_parsed == 0) && ((this->m_req->body)._M_string_length != 0)) {
    local_28.src_ = (this->m_req->body)._M_dataplus._M_p;
    local_28.head_ = local_28.src_;
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
    ::ParseStream<160u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
              ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                *)&this->m_body,&local_28);
    this->m_parsed = 2 - (uint)((this->m_body).parseResult_.code_ == kParseErrorNone);
    iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[3])(this);
    iVar2 = (int)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
    if ((char)iVar1 != '\0') {
      iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xe])(this);
      if (iVar1 != 2) {
        iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])(this);
        local_48.s = "error";
        local_48.length = 5;
        uVar3 = (ulong)(this->m_body).parseResult_.code_;
        if (uVar3 < 0x12) {
          local_38.s = &DAT_0018d308 + *(int *)(&DAT_0018d308 + uVar3 * 4);
        }
        else {
          local_38.s = "Unknown error.";
        }
        sVar4 = strlen(local_38.s);
        local_38.length = (SizeType)sVar4;
        iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xc])(this);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)CONCAT44(extraout_var,iVar1),&local_48,&local_38,
                    *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)
                     (CONCAT44(extraout_var_00,iVar2) + 0x10));
      }
      iVar2 = 0;
    }
    return iVar2;
  }
  iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[3])
                    (this,CONCAT44(in_register_00000034,__fd));
  return iVar1;
}

Assistant:

bool xmrig::HttpApiRequest::accept()
{
    using namespace rapidjson;

    ApiRequest::accept();

    if (m_parsed == 0 && !m_req.body.empty()) {
        m_body.Parse<kParseCommentsFlag | kParseTrailingCommasFlag>(m_req.body.c_str());
        m_parsed = m_body.HasParseError() ? 2 : 1;

        if (!hasParseError()) {
            return true;
        }

        if (type() != REQ_JSON_RPC) {
            reply().AddMember(StringRef(kError), StringRef(GetParseError_En(m_body.GetParseError())), doc().GetAllocator());
        }

        return false;
    }

    return hasParseError();
}